

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

bool __thiscall Catch::TestSpecParser::processNoneChar(TestSpecParser *this,char c)

{
  char in_SIL;
  TestSpecParser *in_RDI;
  bool local_1;
  
  if (in_SIL == ' ') {
    local_1 = true;
  }
  else if (in_SIL == '\"') {
    startNewMode(in_RDI,QuotedName);
    local_1 = false;
  }
  else if (in_SIL == '[') {
    startNewMode(in_RDI,Tag);
    local_1 = false;
  }
  else if (in_SIL == '~') {
    in_RDI->m_exclusion = true;
    local_1 = false;
  }
  else {
    startNewMode(in_RDI,Name);
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool TestSpecParser::processNoneChar( char c ) {
        switch( c ) {
        case ' ':
            return true;
        case '~':
            m_exclusion = true;
            return false;
        case '[':
            startNewMode( Tag );
            return false;
        case '"':
            startNewMode( QuotedName );
            return false;
        default:
            startNewMode( Name );
            return false;
        }
    }